

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QEventPoint>::moveAppend
          (QGenericArrayOps<QEventPoint> *this,QEventPoint *b,QEventPoint *e)

{
  QEventPoint *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QEventPoint *in_RDI;
  QEventPoint *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QEventPoint>::begin((QArrayDataPointer<QEventPoint> *)0x2ee787);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QEventPoint::QEventPoint(this_00,in_RDI);
      local_10 = local_10 + 8;
      in_RDI[2].d.d.ptr = in_RDI[2].d.d.ptr + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }